

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_prefix_data(lylyb_ctx *lybctx,LY_VALUE_FORMAT format,void **prefix_data)

{
  size_t sVar1;
  char **local_38;
  lyxml_ns *ns;
  ly_set *set;
  uint8_t i;
  uint8_t count;
  void **ppvStack_20;
  LY_ERR ret;
  void **prefix_data_local;
  lylyb_ctx *plStack_10;
  LY_VALUE_FORMAT format_local;
  lylyb_ctx *lybctx_local;
  
  set._4_4_ = LY_SUCCESS;
  ns = (lyxml_ns *)0x0;
  local_38 = (char **)0x0;
  ppvStack_20 = prefix_data;
  prefix_data_local._4_4_ = format;
  plStack_10 = lybctx;
  if (format == LY_VALUE_XML) {
    lyb_read((uint8_t *)((long)&set + 3),1,lybctx);
    set._4_4_ = ly_set_new((ly_set **)&ns);
    if (set._4_4_ != LY_SUCCESS) goto LAB_00155a08;
    for (set._2_1_ = 0; set._2_1_ < set._3_1_; set._2_1_ = set._2_1_ + 1) {
      local_38 = (char **)calloc(1,0x18);
      set._4_4_ = lyb_read_string(local_38,'\x02',plStack_10);
      if (set._4_4_ != LY_SUCCESS) goto LAB_00155a08;
      sVar1 = strlen(*local_38);
      if (sVar1 == 0) {
        free(*local_38);
        *local_38 = (char *)0x0;
      }
      set._4_4_ = lyb_read_string(local_38 + 1,'\x02',plStack_10);
      if ((set._4_4_ != LY_SUCCESS) ||
         (set._4_4_ = ly_set_add((ly_set *)ns,local_38,'\x01',(uint32_t *)0x0),
         set._4_4_ != LY_SUCCESS)) goto LAB_00155a08;
    }
    *ppvStack_20 = ns;
  }
  else if (1 < format - LY_VALUE_JSON) {
    ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c",
           0x25c);
    set._4_4_ = LY_EINT;
  }
  local_38 = (char **)0x0;
LAB_00155a08:
  if ((set._4_4_ != LY_SUCCESS) &&
     (ly_free_prefix_data(prefix_data_local._4_4_,ns), local_38 != (char **)0x0)) {
    free(*local_38);
    free(local_38[1]);
    free(local_38);
  }
  return set._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_prefix_data(struct lylyb_ctx *lybctx, LY_VALUE_FORMAT format, void **prefix_data)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t count, i;
    struct ly_set *set = NULL;
    struct lyxml_ns *ns = NULL;

    switch (format) {
    case LY_VALUE_XML:
        /* read count */
        lyb_read(&count, 1, lybctx);

        /* read all NS elements */
        LY_CHECK_GOTO(ret = ly_set_new(&set), cleanup);

        for (i = 0; i < count; ++i) {
            ns = calloc(1, sizeof *ns);

            /* prefix */
            LY_CHECK_GOTO(ret = lyb_read_string(&ns->prefix, sizeof(uint16_t), lybctx), cleanup);
            if (!strlen(ns->prefix)) {
                free(ns->prefix);
                ns->prefix = NULL;
            }

            /* namespace */
            LY_CHECK_GOTO(ret = lyb_read_string(&ns->uri, sizeof(uint16_t), lybctx), cleanup);

            LY_CHECK_GOTO(ret = ly_set_add(set, ns, 1, NULL), cleanup);
            ns = NULL;
        }

        *prefix_data = set;
        break;
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        /* nothing stored */
        break;
    default:
        LOGINT(lybctx->ctx);
        ret = LY_EINT;
        break;
    }

cleanup:
    if (ret) {
        ly_free_prefix_data(format, set);
        if (ns) {
            free(ns->prefix);
            free(ns->uri);
            free(ns);
        }
    }
    return ret;
}